

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesFloatingBase
          (BerdyHelper *this,LinkProperAccArray *properAccs,
          LinkNetTotalWrenchesWithoutGravity *param_3,LinkNetExternalWrenches *netExtWrenches,
          LinkInternalWrenches *linkJointWrenches,JointDOFsDoubleArray *param_6,
          JointDOFsDoubleArray *jointAccs,VectorDynSize *d)

{
  IndexRange range;
  int iVar1;
  uint uVar2;
  long lVar3;
  Twist *vec;
  long lVar4;
  long *plVar5;
  LinkWrenches *in_RCX;
  LinkAccArray *in_RSI;
  BerdyHelper *in_RDI;
  LinkWrenches *in_R8;
  VectorDynSize *in_stack_00000008;
  BerdyHelper *in_stack_00000010;
  DOFIndex dofIdx;
  uint localDof;
  LinkIndex childLinkIndex;
  IJointPtr joint;
  JointIndex jntIdx;
  ClassicalAcc sensorProperAcc;
  LinkIndex link;
  BerdyHelper *subVec;
  undefined4 in_stack_fffffffffffffe70;
  BerdyHelper *pBVar6;
  LinkIndex in_stack_fffffffffffffe80;
  BerdyDynamicVariablesTypes dynamicVariableType;
  BerdyHelper *in_stack_fffffffffffffe90;
  BerdyHelper *in_stack_fffffffffffffe98;
  BerdyHelper *pBVar7;
  Matrix<double,_6,_1,_0,_6,_1> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed4;
  uint uVar8;
  IndexRange in_stack_fffffffffffffed8;
  SpatialForceVector *in_stack_fffffffffffffef8;
  long local_d0;
  SpatialAcc local_68;
  BerdyHelper *local_38;
  LinkWrenches *local_28;
  LinkWrenches *local_20;
  LinkAccArray *local_10;
  
  pBVar7 = in_stack_00000010;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  getNrOfDynamicVariables(in_RDI);
  iDynTree::VectorDynSize::resize((ulong)pBVar7);
  local_38 = (BerdyHelper *)0x0;
  while (pBVar7 = local_38, lVar3 = iDynTree::Model::getNrOfLinks(), (long)pBVar7 < lVar3) {
    ClassicalAcc::ClassicalAcc((ClassicalAcc *)0x526a24);
    vec = (Twist *)iDynTree::LinkAccArray::operator()(local_10,(long)local_38);
    iDynTree::LinkVelArray::operator()(&in_RDI->m_linkVels,(long)local_38);
    iDynTree::ClassicalAcc::fromSpatial(&local_68,vec);
    in_stack_fffffffffffffe90 = in_stack_00000010;
    getRangeLinkVariable
              (in_stack_00000010,(BerdyDynamicVariablesTypes)((ulong)vec >> 0x20),
               in_stack_fffffffffffffe80);
    toEigen<6U>((VectorFixSize<6U> *)vec);
    dynamicVariableType = (BerdyDynamicVariablesTypes)((ulong)vec >> 0x20);
    setSubVector<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>>
              ((VectorDynSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffed8,
               (Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffffec8);
    in_stack_fffffffffffffe98 = in_stack_00000010;
    getRangeLinkVariable(in_stack_fffffffffffffe90,dynamicVariableType,in_stack_fffffffffffffe80);
    iDynTree::LinkWrenches::operator()(local_20,(long)local_38);
    toEigen(in_stack_fffffffffffffef8);
    setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
              ((VectorDynSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffed8,in_stack_fffffffffffffec8);
    local_38 = (BerdyHelper *)&local_38->field_0x1;
  }
  local_d0 = 0;
  while (lVar3 = local_d0, lVar4 = iDynTree::Model::getNrOfJoints(), lVar3 < lVar4) {
    plVar5 = (long *)iDynTree::Model::getJoint((long)in_RDI);
    lVar4 = iDynTree::Traversal::getChildLinkIndexFromJointIndex
                      ((Model *)&in_RDI->m_dynamicsTraversal,(long)in_RDI);
    pBVar6 = in_stack_00000010;
    getRangeJointVariable
              (pBVar7,(BerdyDynamicVariablesTypes)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (JointIndex)in_stack_fffffffffffffe90);
    iDynTree::LinkWrenches::operator()(local_28,lVar4);
    toEigen(in_stack_fffffffffffffef8);
    setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
              ((VectorDynSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffed8,in_stack_fffffffffffffec8);
    iVar1 = (**(code **)(*plVar5 + 0x20))();
    if (iVar1 != 0) {
      uVar8 = 0;
      while (in_stack_fffffffffffffed4 = uVar8, uVar2 = (**(code **)(*plVar5 + 0x20))(),
            uVar8 < uVar2) {
        lVar4 = (**(code **)(*plVar5 + 0xc0))();
        in_stack_fffffffffffffec8 =
             (Matrix<double,_6,_1,_0,_6,_1> *)(lVar4 + (ulong)in_stack_fffffffffffffed4);
        subVec = in_stack_00000010;
        getRangeDOFVariable(pBVar7,(BerdyDynamicVariablesTypes)
                                   ((ulong)in_stack_fffffffffffffe98 >> 0x20),
                            (DOFIndex)in_stack_fffffffffffffe90);
        iDynTree::VectorDynSize::operator()(in_stack_00000008,(ulong)in_stack_fffffffffffffec8);
        range.size = lVar3;
        range.offset = (ptrdiff_t)pBVar6;
        setSubVector((VectorDynSize *)CONCAT44(uVar8,in_stack_fffffffffffffe70),range,(double)subVec
                    );
        uVar8 = in_stack_fffffffffffffed4 + 1;
      }
    }
    local_d0 = local_d0 + 1;
  }
  return true;
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesFloatingBase(LinkProperAccArray& properAccs,
                                                     LinkNetTotalWrenchesWithoutGravity& /*netTotalWrenchesWithoutGrav*/,
                                                     LinkNetExternalWrenches& netExtWrenches,
                                                     LinkInternalWrenches& linkJointWrenches,
                                                     JointDOFsDoubleArray&,
                                                     JointDOFsDoubleArray& jointAccs,
                                                     VectorDynSize& d)
{
    d.resize(this->getNrOfDynamicVariables());
    assert(this->m_options.berdyVariant == BERDY_FLOATING_BASE);

    for (LinkIndex link = 0; link < static_cast<LinkIndex>(m_model.getNrOfLinks()); ++link)
    {
        // Handle acceleration
        // Convert left trivialized proper acceleration to sensor proper acceleration
        ClassicalAcc sensorProperAcc;

        sensorProperAcc.fromSpatial(properAccs(link), m_linkVels(link));
        setSubVector(d, getRangeLinkVariable(LINK_BODY_PROPER_CLASSICAL_ACCELERATION, link), toEigen(sensorProperAcc));

        // Handle external force
        setSubVector(d, getRangeLinkVariable(NET_EXT_WRENCH, link), toEigen(netExtWrenches(link)));

    }

    for (JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); ++jntIdx)
    {
        IJointPtr joint = m_model.getJoint(jntIdx);

        // Handle joint wrench
        // Warning: for legacy reason linkJointWrenches is addressed using the child link index of its joint
        LinkIndex childLinkIndex = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model, jntIdx);
        setSubVector(d, getRangeJointVariable(JOINT_WRENCH, jntIdx), toEigen(linkJointWrenches(childLinkIndex)));

        // If the joint is not fixed, we also need to serialize the acceleration of the relative dof
        if (joint->getNrOfDOFs() > 0)
        {
            for (unsigned int localDof = 0; localDof < joint->getNrOfDOFs(); localDof++)
            {
                DOFIndex dofIdx =  joint->getDOFsOffset() + localDof;
                setSubVector(d, getRangeDOFVariable(DOF_ACCELERATION, dofIdx), jointAccs(dofIdx));
            }
        }
    }


    return true;
}